

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanLogicalDevice::VulkanLogicalDevice(VulkanLogicalDevice *this,CreateInfo *CI)

{
  VkDevice device;
  pointer pVVar1;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  pointer pVVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  size_type __new_size;
  uint uVar13;
  bool bVar14;
  value_type_conflict1 local_38 [2];
  
  (this->super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>)._M_weak_this.
  super___weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>)._M_weak_this.
  super___weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  device = CI->vkDevice;
  this->m_VkDevice = device;
  this->m_VkAllocator = CI->vkAllocator;
  memcpy(&this->m_EnabledFeatures,CI->EnabledFeatures,0xdc);
  memcpy(&this->m_EnabledExtFeatures,CI->EnabledExtFeatures,0x2e0);
  (this->m_SupportedStagesMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SupportedStagesMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SupportedStagesMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_SupportedAccessMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SupportedAccessMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SupportedAccessMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  volkLoadDevice(device);
  iVar5 = (uint)((this->m_EnabledFeatures).geometryShader != 0) * 0x40;
  iVar8 = 0x87bc;
  if ((this->m_EnabledFeatures).tessellationShader == 0) {
    iVar8 = 0x878c;
  }
  uVar9 = iVar5 + iVar8;
  uVar6 = iVar5 + 0x180000 + iVar8;
  if ((this->m_EnabledExtFeatures).MeshShader.taskShader == 0) {
    uVar6 = uVar9;
  }
  if ((this->m_EnabledExtFeatures).MeshShader.meshShader == 0) {
    uVar6 = uVar9;
  }
  bVar14 = (this->m_EnabledExtFeatures).RayTracingPipeline.rayTracingPipeline == 0;
  uVar9 = 0x600069;
  if (bVar14) {
    uVar9 = 0x69;
  }
  uVar13 = 0x2200802;
  if (bVar14) {
    uVar13 = 0x802;
  }
  bVar14 = (this->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate != 0;
  uVar11 = uVar6 + 0x400000;
  if (!bVar14) {
    uVar11 = uVar6;
  }
  uVar12 = (uint)bVar14 * 0x800000;
  uVar6 = uVar11 | 0x800000;
  uVar4 = uVar12 | 0x1000796;
  if ((this->m_EnabledExtFeatures).FragmentDensityMap.fragmentDensityMap == 0) {
    uVar6 = uVar11;
    uVar4 = uVar12 + 0x796;
  }
  pVVar7 = (CI->PhysicalDevice->m_QueueFamilyProperties).
           super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (CI->PhysicalDevice->m_QueueFamilyProperties).
           super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  __new_size = ((long)pVVar1 - (long)pVVar7 >> 3) * -0x5555555555555555;
  local_38[1] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_SupportedStagesMask,__new_size,local_38 + 1);
  local_38[0] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_SupportedAccessMask,__new_size,local_38);
  if (pVVar1 != pVVar7) {
    pVVar7 = (CI->PhysicalDevice->m_QueueFamilyProperties).
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->m_SupportedStagesMask).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->m_SupportedAccessMask).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      uVar11 = pVVar7->queueFlags;
      if ((uVar11 & 1) == 0) {
        if ((uVar11 & 2) != 0) {
          puVar2[lVar10] = puVar2[lVar10] | uVar13 | 0x17001;
          uVar11 = puVar3[lVar10];
          goto LAB_0026fa65;
        }
        if ((uVar11 & 4) != 0) {
          puVar2[lVar10] = puVar2[lVar10] | 0x17001;
          uVar11 = puVar3[lVar10];
          goto LAB_0026fa67;
        }
      }
      else {
        puVar2[lVar10] = puVar2[lVar10] | uVar6 | uVar13 | 0x17001;
        uVar11 = puVar3[lVar10] | uVar4;
LAB_0026fa65:
        uVar11 = uVar11 | uVar9;
LAB_0026fa67:
        puVar3[lVar10] = uVar11 | 0x7800;
      }
      lVar10 = lVar10 + 1;
      pVVar7 = pVVar7 + 1;
    } while (__new_size + (__new_size == 0) != lVar10);
  }
  return;
}

Assistant:

VulkanLogicalDevice::VulkanLogicalDevice(const CreateInfo& CI) :
    m_VkDevice{CI.vkDevice},
    m_VkAllocator{CI.vkAllocator},
    m_EnabledFeatures{CI.EnabledFeatures},
    m_EnabledExtFeatures{CI.EnabledExtFeatures}
{
#if DILIGENT_USE_VOLK
    // Since we only use one device at this time, load device function entries
    // https://github.com/zeux/volk#optimizing-device-calls
    volkLoadDevice(m_VkDevice);
#endif

    VkPipelineStageFlags GraphicsStages =
        VK_PIPELINE_STAGE_VERTEX_SHADER_BIT |
        VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT |
        VK_PIPELINE_STAGE_VERTEX_INPUT_BIT |
        VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT |
        VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT |
        VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT |
        VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT;
    VkPipelineStageFlags ComputeStages =
        VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT |
        VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT;

    VkAccessFlags GraphicsAccessMask =
        VK_ACCESS_INDEX_READ_BIT |
        VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT |
        VK_ACCESS_INPUT_ATTACHMENT_READ_BIT |
        VK_ACCESS_COLOR_ATTACHMENT_READ_BIT |
        VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT |
        VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT |
        VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT;
    VkAccessFlags ComputeAccessMask =
        VK_ACCESS_INDIRECT_COMMAND_READ_BIT |
        VK_ACCESS_UNIFORM_READ_BIT |
        VK_ACCESS_SHADER_READ_BIT |
        VK_ACCESS_SHADER_WRITE_BIT;
    VkAccessFlags TransferAccessMask =
        VK_ACCESS_TRANSFER_READ_BIT |
        VK_ACCESS_TRANSFER_WRITE_BIT |
        VK_ACCESS_HOST_READ_BIT |
        VK_ACCESS_HOST_WRITE_BIT;

    if (m_EnabledFeatures.geometryShader)
        GraphicsStages |= VK_PIPELINE_STAGE_GEOMETRY_SHADER_BIT;
    if (m_EnabledFeatures.tessellationShader)
        GraphicsStages |= VK_PIPELINE_STAGE_TESSELLATION_CONTROL_SHADER_BIT | VK_PIPELINE_STAGE_TESSELLATION_EVALUATION_SHADER_BIT;
    if (m_EnabledExtFeatures.MeshShader.meshShader != VK_FALSE && m_EnabledExtFeatures.MeshShader.taskShader != VK_FALSE)
        GraphicsStages |= VK_PIPELINE_STAGE_TASK_SHADER_BIT_EXT | VK_PIPELINE_STAGE_MESH_SHADER_BIT_EXT;
    if (m_EnabledExtFeatures.RayTracingPipeline.rayTracingPipeline != VK_FALSE)
    {
        ComputeStages |= VK_PIPELINE_STAGE_RAY_TRACING_SHADER_BIT_KHR | VK_PIPELINE_STAGE_ACCELERATION_STRUCTURE_BUILD_BIT_KHR;
        ComputeAccessMask |= VK_ACCESS_ACCELERATION_STRUCTURE_READ_BIT_KHR | VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR;
    }
    if (m_EnabledExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE)
    {
        GraphicsStages |= VK_PIPELINE_STAGE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR;
        GraphicsAccessMask |= VK_ACCESS_FRAGMENT_SHADING_RATE_ATTACHMENT_READ_BIT_KHR;
    }
    if (m_EnabledExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE)
    {
        GraphicsStages |= VK_PIPELINE_STAGE_FRAGMENT_DENSITY_PROCESS_BIT_EXT;
        GraphicsAccessMask |= VK_ACCESS_FRAGMENT_DENSITY_MAP_READ_BIT_EXT;
    }

    const size_t QueueCount = CI.PhysicalDevice.GetQueueProperties().size();
    m_SupportedStagesMask.resize(QueueCount, 0);
    m_SupportedAccessMask.resize(QueueCount, 0);
    for (size_t q = 0; q < QueueCount; ++q)
    {
        const VkQueueFamilyProperties& Queue      = CI.PhysicalDevice.GetQueueProperties()[q];
        VkPipelineStageFlags&          StageMask  = m_SupportedStagesMask[q];
        VkAccessFlags&                 AccessMask = m_SupportedAccessMask[q];

        if (Queue.queueFlags & VK_QUEUE_GRAPHICS_BIT)
        {
            StageMask |= GraphicsStages | ComputeStages | VK_PIPELINE_STAGE_ALL_TRANSFER;
            AccessMask |= GraphicsAccessMask | ComputeAccessMask | TransferAccessMask;
        }
        else if (Queue.queueFlags & VK_QUEUE_COMPUTE_BIT)
        {
            StageMask |= ComputeStages | VK_PIPELINE_STAGE_ALL_TRANSFER;
            AccessMask |= ComputeAccessMask | TransferAccessMask;
        }
        else if (Queue.queueFlags & VK_QUEUE_TRANSFER_BIT)
        {
            StageMask |= VK_PIPELINE_STAGE_ALL_TRANSFER;
            AccessMask |= TransferAccessMask;
        }
    }
}